

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

char * oaffect_loc_name(int location)

{
  char *pcVar1;
  uint in_EDI;
  string_view fmt;
  int local_4;
  
  if (in_EDI < 7) {
    pcVar1 = &DAT_0039d384 + *(int *)(&DAT_0039d384 + (ulong)in_EDI * 4);
  }
  else {
    fmt._M_str = "oaffect_loc_name: unknown  location {}.";
    fmt._M_len = 0x27;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt,&local_4);
    pcVar1 = "(unknown)";
  }
  return pcVar1;
}

Assistant:

char *oaffect_loc_name(int location)
{
	switch (location)
	{
		case APPLY_OBJ_NONE:
			return "none";
		case APPLY_OBJ_V0:
			return "value0";
		case APPLY_OBJ_V1:
			return "value1";
		case APPLY_OBJ_V2:
			return "value2";
		case APPLY_OBJ_V3:
			return "value3";
		case APPLY_OBJ_V4:
			return "value4";
		case APPLY_OBJ_WEIGHT:
			return "weight";
	}

	RS.Logger.Warn("oaffect_loc_name: unknown  location {}.", location);
	return "(unknown)";
}